

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ReserveGrowth_Test::TestBody
          (RepeatedField_ReserveGrowth_Test *this)

{
  uint uVar1;
  ulong uVar2;
  LogMessage *this_00;
  int iVar3;
  char *message;
  int iVar4;
  string_view str;
  int next;
  uint local_5c;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  LogMessage local_40;
  
  uVar2 = 2;
  iVar4 = 4;
  do {
    local_5c = (uint)(uVar2 * 8 + 8 >> 2);
    iVar3 = 2;
    uVar1 = (uint)uVar2;
    if (0 < (int)uVar1) {
      if (uVar1 < 0x3ffffffc) {
        if (uVar1 == 1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                     ,0x493,"capacity == 0 || capacity >= lower_limit");
          local_58.data_._0_4_ = 1;
          this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                              (&local_40,(int *)&local_58);
          str._M_str = " ";
          str._M_len = 1;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (this_00,str);
          local_58.data_._0_4_ = 2;
          absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_00,(int *)&local_58)
          ;
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_40);
        }
        iVar3 = uVar1 * 2 + 2;
      }
      else {
        iVar3 = 0x7fffffff;
      }
    }
    local_40.errno_saver_.saved_errno_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              (local_50,"next",
               "(internal::CalculateReserveSize<int, sizeof(void*)>( size, size + 1))",
               (int *)&local_5c,(int *)&local_40);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      message = anon_var_dwarf_a22956 + 5;
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0x1cf,message);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_40._4_4_,local_40.errno_saver_.saved_errno_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_40._4_4_,local_40.errno_saver_.saved_errno_) + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    uVar2 = (ulong)local_5c;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

TEST(RepeatedField, ReserveGrowth) {
  // Make sure the field capacity doubles in size on repeated reservation.
  for (int size = internal::RepeatedFieldLowerClampLimit<int, sizeof(void*)>(),
           i = 0;
       i < 4; ++i) {
    int next =
        sizeof(Arena*) >= sizeof(int)
            ?
            // for small enough elements, we double number of total bytes
            ((2 * (size * sizeof(int) + sizeof(Arena*))) - sizeof(Arena*)) /
                sizeof(int)
            :
            // we just double the number of elements if too large size.
            size * 2;
    EXPECT_EQ(next, (internal::CalculateReserveSize<int, sizeof(void*)>(
                        size, size + 1)));
    size = next;
  }
}